

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

void __thiscall pixels::fillPattern1(pixels *this)

{
  pointer puVar1;
  pointer pfVar2;
  pointer puVar3;
  char cVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  unsigned_short uVar11;
  float fVar12;
  
  iVar8 = this->_h;
  if (0 < iVar8) {
    puVar1 = (this->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = (this->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = this->_w;
    iVar7 = 0;
    do {
      if (0 < iVar9) {
        iVar8 = 0;
        do {
          lVar10 = (long)(this->_stride_x * iVar7 + iVar8);
          uVar5 = iVar8 + iVar7 & 1;
          fVar12 = (float)uVar5;
          puVar1[lVar10] = uVar5;
          pfVar2[lVar10] = fVar12;
          if ((uint)fVar12 < 0x38800000) {
            if ((uint)fVar12 < 0x33000001) {
              uVar11 = 0;
            }
            else {
              uVar5 = (uint)fVar12 & 0x7fffff | 0x800000;
              cVar4 = (char)((uint)fVar12 >> 0x17);
              uVar11 = (unsigned_short)(uVar5 >> (0x7eU - cVar4 & 0x1f));
              if (0x80000000 < uVar5 << (cVar4 + 0xa2U & 0x1f)) {
                uVar11 = uVar11 + 1;
              }
            }
          }
          else if ((uint)fVar12 < 0x7f800000) {
            if ((uint)fVar12 < 0x477ff000) {
              uVar11 = (unsigned_short)
                       ((int)fVar12 + 0x8000fff + (uint)(((uint)fVar12 >> 0xd & 1) != 0) >> 0xd);
            }
            else {
              uVar11 = 0x7c00;
            }
          }
          else {
            uVar11 = 0x7c00;
            if (fVar12 != INFINITY) {
              uVar5 = (uint)fVar12 >> 0xd & 0x3ff;
              uVar11 = (ushort)(uVar5 == 0) | (ushort)uVar5 | 0x7c00;
            }
          }
          puVar3[lVar10] = uVar11;
          lVar6 = 0x58;
          do {
            *(unsigned_short *)(*(long *)((long)this->rgba + lVar6 + -0x58) + lVar10 * 2) = uVar11;
            lVar6 = lVar6 + 0x18;
          } while (lVar6 != 0xb8);
          iVar8 = iVar8 + 1;
          iVar9 = this->_w;
        } while (iVar8 < iVar9);
        iVar8 = this->_h;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar8);
  }
  return;
}

Assistant:

void fillPattern1 ()
    {
        for (int y = 0; y < _h; ++y)
        {
            for (int x = 0; x < _w; ++x)
            {
                size_t idx = y * _stride_x + x;
                i[idx]     = (x + y) & 1;
                f[idx]     = float (i[idx]);
                h[idx]     = half (f[idx]).bits ();
                for (int c = 0; c < 4; ++c)
                    rgba[c][idx] = h[idx];
            }
        }
    }